

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ticket.c
# Opt level: O0

int ssl_load_session(mbedtls_ssl_session *session,uchar *buf,size_t len)

{
  int iVar1;
  uchar *puVar2;
  size_t buflen;
  mbedtls_x509_crt *pmVar3;
  int ret;
  size_t cert_len;
  uchar *end;
  uchar *p;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ssl_session *session_local;
  
  puVar2 = buf + len;
  if (puVar2 < buf + 0x98) {
    session_local._4_4_ = -0x7100;
  }
  else {
    memcpy(session,buf,0x98);
    if (puVar2 < buf + 0x9b) {
      session_local._4_4_ = -0x7100;
    }
    else {
      buflen = (size_t)(int)((uint)buf[0x98] << 0x10 | (uint)buf[0x99] << 8 | (uint)buf[0x9a]);
      end = buf + 0x9b;
      if (buflen == 0) {
        session->peer_cert = (mbedtls_x509_crt *)0x0;
      }
      else {
        if (puVar2 < end + buflen) {
          return -0x7100;
        }
        pmVar3 = (mbedtls_x509_crt *)calloc(1,0x228);
        session->peer_cert = pmVar3;
        if (session->peer_cert == (mbedtls_x509_crt *)0x0) {
          return -0x7f00;
        }
        mbedtls_x509_crt_init(session->peer_cert);
        iVar1 = mbedtls_x509_crt_parse_der(session->peer_cert,end,buflen);
        if (iVar1 != 0) {
          mbedtls_x509_crt_free(session->peer_cert);
          free(session->peer_cert);
          session->peer_cert = (mbedtls_x509_crt *)0x0;
          return iVar1;
        }
        end = end + buflen;
      }
      if (end == puVar2) {
        session_local._4_4_ = 0;
      }
      else {
        session_local._4_4_ = -0x7100;
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

static int ssl_load_session( mbedtls_ssl_session *session,
                             const unsigned char *buf, size_t len )
{
    const unsigned char *p = buf;
    const unsigned char * const end = buf + len;
#if defined(MBEDTLS_X509_CRT_PARSE_C)
    size_t cert_len;
#endif /* MBEDTLS_X509_CRT_PARSE_C */

    if( p + sizeof( mbedtls_ssl_session ) > end )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    memcpy( session, p, sizeof( mbedtls_ssl_session ) );
    p += sizeof( mbedtls_ssl_session );

#if defined(MBEDTLS_X509_CRT_PARSE_C)
    if( p + 3 > end )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    cert_len = ( p[0] << 16 ) | ( p[1] << 8 ) | p[2];
    p += 3;

    if( cert_len == 0 )
    {
        session->peer_cert = NULL;
    }
    else
    {
        int ret;

        if( p + cert_len > end )
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

        session->peer_cert = mbedtls_calloc( 1, sizeof( mbedtls_x509_crt ) );

        if( session->peer_cert == NULL )
            return( MBEDTLS_ERR_SSL_ALLOC_FAILED );

        mbedtls_x509_crt_init( session->peer_cert );

        if( ( ret = mbedtls_x509_crt_parse_der( session->peer_cert,
                                        p, cert_len ) ) != 0 )
        {
            mbedtls_x509_crt_free( session->peer_cert );
            mbedtls_free( session->peer_cert );
            session->peer_cert = NULL;
            return( ret );
        }

        p += cert_len;
    }
#endif /* MBEDTLS_X509_CRT_PARSE_C */

    if( p != end )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    return( 0 );
}